

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

bool __thiscall Character::DelItem(Character *this,short item,int amount)

{
  int iVar1;
  bool bVar2;
  pointer pCVar3;
  const_iterator local_38;
  _Self local_30;
  _Self local_28;
  iterator it;
  int amount_local;
  short item_local;
  Character *this_local;
  
  if (0 < amount) {
    it._M_node._0_4_ = amount;
    it._M_node._6_2_ = item;
    local_28._M_node =
         (_List_node_base *)
         std::begin<std::__cxx11::list<Character_Item,std::allocator<Character_Item>>>
                   (&this->inventory);
    while( true ) {
      local_30._M_node =
           (_List_node_base *)
           std::end<std::__cxx11::list<Character_Item,std::allocator<Character_Item>>>
                     (&this->inventory);
      bVar2 = std::operator!=(&local_28,&local_30);
      if (!bVar2) break;
      pCVar3 = std::_List_iterator<Character_Item>::operator->(&local_28);
      if (pCVar3->id == it._M_node._6_2_) {
        pCVar3 = std::_List_iterator<Character_Item>::operator->(&local_28);
        if ((pCVar3->amount < 0) ||
           (pCVar3 = std::_List_iterator<Character_Item>::operator->(&local_28),
           iVar1 = (int)it._M_node, pCVar3->amount - (int)it._M_node < 1)) {
          std::_List_const_iterator<Character_Item>::_List_const_iterator(&local_38,&local_28);
          std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::erase
                    (&this->inventory,local_38);
        }
        else {
          pCVar3 = std::_List_iterator<Character_Item>::operator->(&local_28);
          pCVar3->amount = pCVar3->amount - iVar1;
        }
        CalculateStats(this,true);
        return true;
      }
      std::_List_iterator<Character_Item>::operator++(&local_28);
    }
  }
  return false;
}

Assistant:

bool Character::DelItem(short item, int amount)
{
	if (amount <= 0)
	{
		return false;
	}

	UTIL_IFOREACH(this->inventory, it)
	{
		if (it->id == item)
		{
			if (it->amount < 0 || it->amount - amount <= 0)
			{
				this->inventory.erase(it);
			}
			else
			{
				it->amount -= amount;
			}

			this->CalculateStats();

			return true;
		}
	}

	return false;
}